

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2cSimulationDataGenerator.cpp
# Opt level: O2

void __thiscall
I2cSimulationDataGenerator::SafeChangeSda(I2cSimulationDataGenerator *this,BitState bit_state)

{
  BitState BVar1;
  int iVar2;
  
  BVar1 = SimulationChannelDescriptor::GetCurrentBitState();
  if (BVar1 == bit_state) {
    return;
  }
  iVar2 = SimulationChannelDescriptor::GetCurrentBitState();
  if (iVar2 == 1) {
    SimulationChannelDescriptor::Transition();
    ClockGenerator::AdvanceByHalfPeriod(1.0);
    SimulationChannelDescriptorGroup::AdvanceAll((int)this + 0x18);
  }
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptorGroup::AdvanceAll((int)this + 0x18);
  return;
}

Assistant:

void I2cSimulationDataGenerator::SafeChangeSda( BitState bit_state )
{
    if( mSda->GetCurrentBitState() != bit_state )
    {
        // make sure SCK is low before we toggle it
        if( mScl->GetCurrentBitState() == BIT_HIGH )
        {
            mScl->Transition();
            mI2cSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1.0 ) );
        }

        mSda->Transition();
        mI2cSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1.0 ) );
    }
}